

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QByteArray,QByteArray>::emplace_helper<QByteArray_const&>
          (QMultiHash<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *args)

{
  long lVar1;
  piter it;
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *in_RCX;
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *in_RDX;
  MultiNode<QByteArray,_QByteArray> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  MultiNode<QByteArray,_QByteArray> *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::findOrInsert<QByteArray>
            (in_RDX,(QByteArray *)in_RCX);
  QHashPrivate::iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::node
            ((iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)in_RCX);
  QHashPrivate::MultiNode<QByteArray,QByteArray>::createInPlace<QByteArray_const&>
            (n,(QByteArray *)in_RDX,(QByteArray *)in_RCX);
  (in_RSI->key).d.ptr = (in_RSI->key).d.ptr + 1;
  it.bucket = (size_t)in_RDX;
  it.d = in_RCX;
  QMultiHash<QByteArray,_QByteArray>::iterator::iterator((iterator *)in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }